

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish.cpp
# Opt level: O2

int __thiscall ncnn::Swish::forward_inplace(Swish *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  float fVar10;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  pvVar9 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  sVar3 = bottom_top_blob->elemsize;
  uVar7 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar7;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      fVar1 = *(float *)((long)pvVar9 + uVar6 * 4);
      fVar10 = expf(-fVar1);
      *(float *)((long)pvVar9 + uVar6 * 4) = fVar1 / (fVar10 + 1.0);
    }
    pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
  }
  return 0;
}

Assistant:

int Swish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            float x = ptr[i];
            ptr[i] = x / (1.f + expf(-x));
        }
    }

    return 0;
}